

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  byte *pbVar1;
  curl_trc_feat *pcVar2;
  byte bVar3;
  Curl_cwriter_phase phase;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  size_t sVar7;
  Curl_cwriter *pCVar8;
  ulong uVar9;
  char *pcVar10;
  Curl_cwtype **ppCVar11;
  byte *pbVar12;
  ulong max;
  Curl_cwtype *ce;
  Curl_cwtype *cwt;
  bool bVar13;
  bool bVar14;
  Curl_cwriter *writer;
  ulong local_38;
  
  bVar13 = is_transfer == 0;
  local_38 = (ulong)bVar13;
  pcVar10 = "content";
  if (!bVar13) {
    pcVar10 = "transfer";
  }
  phase = (uint)bVar13 * 2 + CURL_CW_TRANSFER_DECODE;
  bVar13 = false;
LAB_0011bf9a:
  while ((uVar6 = (ulong)(byte)*enclist, uVar6 < 0x2d &&
         ((0x100100000200U >> (uVar6 & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  uVar9 = 1;
  max = 0;
  pbVar12 = (byte *)enclist;
  while ((bVar3 = (byte)uVar6, bVar3 != 0 && ((int)uVar6 != 0x2c))) {
    if (' ' < (char)bVar3) {
      max = uVar9;
    }
    pbVar1 = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
    uVar9 = uVar9 + 1;
    uVar6 = (ulong)*pbVar1;
  }
  if (max != 0) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"looking for %s decoder: %.*s",pcVar10,max & 0xffffffff,enclist);
    }
    if ((is_transfer != 0) && (max == 7)) {
      iVar4 = curl_strnequal(enclist,"chunked",7);
      bVar14 = iVar4 != 0;
      uVar6 = *(ulong *)&(data->set).field_0x89c;
LAB_0011c070:
      if ((((uint)uVar6 >> 0x18 & 1) == 0) && (!bVar14)) goto LAB_0011c082;
LAB_0011c123:
      sVar7 = Curl_cwriter_count(data,phase);
      if (sVar7 - 4 < 0xfffffffffffffffb) {
        Curl_failf(data,"Reject response due to more than %u content encodings",5);
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (is_transfer != 0) {
        for (ppCVar11 = transfer_unencoders; cwt = *ppCVar11, cwt != (Curl_cwtype *)0x0;
            ppCVar11 = ppCVar11 + 1) {
          iVar4 = curl_strnequal(enclist,cwt->name,max);
          if (((iVar4 != 0) && (cwt->name[max] == '\0')) ||
             ((cwt->alias != (char *)0x0 &&
              ((iVar4 = curl_strnequal(enclist,cwt->alias,max), iVar4 != 0 &&
               (cwt->alias[max] == '\0')))))) goto LAB_0011c1f2;
        }
      }
      for (ppCVar11 = general_unencoders; cwt = *ppCVar11, cwt != (Curl_cwtype *)0x0;
          ppCVar11 = ppCVar11 + 1) {
        iVar4 = curl_strnequal(enclist,cwt->name,max);
        if (((iVar4 != 0) && (cwt->name[max] == '\0')) ||
           ((cwt->alias != (char *)0x0 &&
            ((iVar4 = curl_strnequal(enclist,cwt->alias,max), iVar4 != 0 &&
             (cwt->alias[max] == '\0')))))) goto LAB_0011c1f2;
      }
      cwt = &error_writer;
      goto LAB_0011c22b;
    }
    uVar6 = *(ulong *)&(data->set).field_0x89c;
    if (is_transfer != 0) {
      bVar14 = false;
      goto LAB_0011c070;
    }
    if ((uVar6 >> 0x25 & 1) == 0) {
      bVar14 = false;
      goto LAB_0011c123;
    }
LAB_0011c082:
    iVar4 = curl_strnequal(enclist,"identity",8);
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
        (0 < Curl_trc_feat_write.log_level)))) {
      Curl_trc_write(data,"decoder not requested, ignored: %.*s",max & 0xffffffff,enclist);
    }
    if (is_transfer == 0) {
      return CURLE_OK;
    }
    if (((data->set).field_0x8a0 & 0x10) != 0) {
      return CURLE_OK;
    }
    if (bVar13) {
      pcVar10 = "A Transfer-Encoding (%.*s) was listed after chunked";
LAB_0011c334:
      Curl_failf(data,pcVar10,max & 0xffffffff,enclist);
      return CURLE_BAD_CONTENT_ENCODING;
    }
    if (iVar4 == 0) {
      pcVar10 = "Unsolicited Transfer-Encoding (%.*s) found";
      goto LAB_0011c334;
    }
    bVar13 = false;
    goto LAB_0011c2e3;
  }
  goto LAB_0011c2e7;
LAB_0011c1f2:
  if (bVar14) {
    pCVar8 = Curl_cwriter_get_by_type(data,cwt);
    if (pCVar8 != (Curl_cwriter *)0x0) {
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x89f & 0x40) != 0) {
        pcVar2 = (data->state).feat;
        if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
          return CURLE_OK;
        }
        if (0 < Curl_trc_feat_write.log_level) {
          Curl_trc_write(data,"ignoring duplicate \'chunked\' decoder");
          return CURLE_OK;
        }
        return CURLE_OK;
      }
      return CURLE_OK;
    }
  }
  else {
LAB_0011c22b:
    if (((local_38 & 1) == 0 && !bVar14) &&
       (pCVar8 = Curl_cwriter_get_by_name(data,"chunked"), pCVar8 != (Curl_cwriter *)0x0)) {
      Curl_failf(data,"Reject response due to \'chunked\' not being the last Transfer-Encoding");
      return CURLE_BAD_CONTENT_ENCODING;
    }
  }
  CVar5 = Curl_cwriter_create(&writer,data,cwt,phase);
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"added %s decoder %s -> %d",pcVar10,cwt->name,(ulong)CVar5);
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  CVar5 = Curl_cwriter_add(data,writer);
  if (CVar5 != CURLE_OK) {
    Curl_cwriter_free(data,writer);
    return CVar5;
  }
  bVar13 = (bool)(bVar14 | bVar13);
LAB_0011c2e3:
  bVar3 = *pbVar12;
LAB_0011c2e7:
  enclist = (char *)pbVar12;
  if (bVar3 == 0) {
    return CURLE_OK;
  }
  goto LAB_0011bf9a;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer ?
    CURL_CW_TRANSFER_DECODE : CURL_CW_CONTENT_DECODE;
  CURLcode result;
  bool has_chunked = FALSE;

  do {
    const char *name;
    size_t namelen;
    bool is_chunked = FALSE;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(*enclist > ' ')
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      CURL_TRC_WRITE(data, "looking for %s decoder: %.*s",
                     is_transfer ? "transfer" : "content", (int)namelen, name);
      is_chunked = (is_transfer && (namelen == 7) &&
                    strncasecompare(name, "chunked", 7));
      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding && !is_chunked) ||
         (!is_transfer && data->set.http_ce_skip)) {
        bool is_identity = strncasecompare(name, "identity", 8);
        /* not requested, ignore */
        CURL_TRC_WRITE(data, "decoder not requested, ignored: %.*s",
                       (int)namelen, name);
        if(is_transfer && !data->set.http_te_skip) {
          if(has_chunked)
            failf(data, "A Transfer-Encoding (%.*s) was listed after chunked",
                  (int)namelen, name);
          else if(is_identity)
            continue;
          else
            failf(data, "Unsolicited Transfer-Encoding (%.*s) found",
                  (int)namelen, name);
          return CURLE_BAD_CONTENT_ENCODING;
        }
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(cwt && is_chunked && Curl_cwriter_get_by_type(data, cwt)) {
        /* A 'chunked' transfer encoding has already been added.
         * Ignore duplicates. See #13451.
         * Also RFC 9112, ch. 6.1:
         * "A sender MUST NOT apply the chunked transfer coding more than
         *  once to a message body."
         */
        CURL_TRC_WRITE(data, "ignoring duplicate 'chunked' decoder");
        return CURLE_OK;
      }

      if(is_transfer && !is_chunked &&
         Curl_cwriter_get_by_name(data, "chunked")) {
        /* RFC 9112, ch. 6.1:
         * "If any transfer coding other than chunked is applied to a
         *  response's content, the sender MUST either apply chunked as the
         *  final transfer coding or terminate the message by closing the
         *  connection."
         * "chunked" must be the last added to be the first in its phase,
         *  reject this.
         */
        failf(data, "Reject response due to 'chunked' not being the last "
              "Transfer-Encoding");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      CURL_TRC_WRITE(data, "added %s decoder %s -> %d",
                     is_transfer ? "transfer" : "content", cwt->name, result);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
      if(is_chunked)
        has_chunked = TRUE;
    }
  } while(*enclist);

  return CURLE_OK;
}